

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O0

int set_message_correlation_id(MESSAGE_HANDLE message,char *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  AMQP_VALUE correlation_id_value;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  AMQP_VALUE amqp_value;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  PROPERTIES_HANDLE properties;
  char *pcStack_18;
  int result;
  char *value_local;
  MESSAGE_HANDLE message_local;
  
  l = (LOGGER_LOG)0x0;
  pcStack_18 = value;
  value_local = (char *)message;
  iVar1 = message_get_properties(message,(PROPERTIES_HANDLE *)&l);
  if (iVar1 == 0) {
    if ((l == (LOGGER_LOG)0x0) &&
       (l = (LOGGER_LOG)properties_create(), (PROPERTIES_HANDLE)l == (PROPERTIES_HANDLE)0x0)) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                  ,"set_message_correlation_id",0xb1,1,"Failed creating properties for AMQP message"
                 );
      }
      properties._4_4_ = 0xb2;
    }
    else {
      correlation_id_value = amqpvalue_create_string(pcStack_18);
      if (correlation_id_value == (AMQP_VALUE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"set_message_correlation_id",0xba,1,
                    "Failed creating AMQP value for correlation-id");
        }
        properties._4_4_ = 0xbb;
      }
      else {
        iVar1 = properties_set_correlation_id((PROPERTIES_HANDLE)l,correlation_id_value);
        if (iVar1 == 0) {
          iVar1 = message_set_properties((MESSAGE_HANDLE)value_local,(PROPERTIES_HANDLE)l);
          if (iVar1 == 0) {
            properties._4_4_ = 0;
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"set_message_correlation_id",0xc6,1,
                        "Failed setting the AMQP message properties");
            }
            properties._4_4_ = 199;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"set_message_correlation_id",0xc1,1,"Failed setting the correlation id");
          }
          properties._4_4_ = 0xc2;
        }
        amqpvalue_destroy(correlation_id_value);
      }
      properties_destroy((PROPERTIES_HANDLE)l);
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"set_message_correlation_id",0xac,1,"Failed getting the AMQP message properties");
    }
    properties._4_4_ = 0xad;
  }
  return properties._4_4_;
}

Assistant:

static int set_message_correlation_id(MESSAGE_HANDLE message, const char* value)
{
    int result;
    PROPERTIES_HANDLE properties = NULL;

    if (message_get_properties(message, &properties) != 0)
    {
        LogError("Failed getting the AMQP message properties");
        result = MU_FAILURE;
    }
    else if (properties == NULL && (properties = properties_create()) == NULL)
    {
        LogError("Failed creating properties for AMQP message");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE amqp_value;

        if ((amqp_value = amqpvalue_create_string(value)) == NULL)
        {
            LogError("Failed creating AMQP value for correlation-id");
            result = MU_FAILURE;
        }
        else
        {
            if (properties_set_correlation_id(properties, amqp_value) != RESULT_OK)
            {
                LogError("Failed setting the correlation id");
                result = MU_FAILURE;
            }
            else if (message_set_properties(message, properties) != RESULT_OK)
            {
                LogError("Failed setting the AMQP message properties");
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }

            amqpvalue_destroy(amqp_value);
        }

        properties_destroy(properties);
    }

    return result;
}